

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffgext(fitsfile *fptr,int hdunum,int *exttype,int *status)

{
  int iVar1;
  int iVar2;
  fitsfile *in_RCX;
  int in_ESI;
  int *in_RDI;
  LONGLONG xheadend;
  int xmaxhdu;
  int xcurhdu;
  int *in_stack_00000178;
  int *in_stack_00000180;
  fitsfile *in_stack_00000188;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined8 in_stack_ffffffffffffffc8;
  undefined8 uVar3;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffd4;
  int local_4;
  
  if (in_RCX->HDUposition < 1) {
    iVar1 = ffmbyt(in_RCX,CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                   (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    if (iVar1 < 1) {
      iVar1 = *(int *)(*(long *)(in_RDI + 2) + 0x54);
      uVar4 = *(undefined4 *)(*(long *)(in_RDI + 2) + 0x60);
      uVar3 = *(undefined8 *)(*(long *)(in_RDI + 2) + 0x70);
      *(int *)(*(long *)(in_RDI + 2) + 0x54) = in_ESI;
      *in_RDI = in_ESI;
      if (in_ESI < *(int *)(*(long *)(in_RDI + 2) + 0x60)) {
        in_ESI = *(int *)(*(long *)(in_RDI + 2) + 0x60);
      }
      *(int *)(*(long *)(in_RDI + 2) + 0x60) = in_ESI;
      *(undefined8 *)(*(long *)(in_RDI + 2) + 0x70) = *(undefined8 *)(*(long *)(in_RDI + 2) + 0x30);
      iVar2 = ffrhdu(in_stack_00000188,in_stack_00000180,in_stack_00000178);
      if (0 < iVar2) {
        *(int *)(*(long *)(in_RDI + 2) + 0x54) = iVar1;
        *in_RDI = iVar1;
        *(undefined4 *)(*(long *)(in_RDI + 2) + 0x60) = uVar4;
        *(undefined8 *)(*(long *)(in_RDI + 2) + 0x70) = uVar3;
      }
    }
    local_4 = in_RCX->HDUposition;
  }
  else {
    local_4 = in_RCX->HDUposition;
  }
  return local_4;
}

Assistant:

int ffgext(fitsfile *fptr,      /* I - FITS file pointer                */
           int hdunum,          /* I - no. of HDU to move get (0 based) */ 
           int *exttype,        /* O - type of extension, 0, 1, or 2    */
           int *status)         /* IO - error status                    */
/*
  Get Extension.  Move to the specified extension and initialize the
  HDU structure.
*/
{
    int xcurhdu, xmaxhdu;
    LONGLONG xheadend;

    if (*status > 0)
        return(*status);

    if (ffmbyt(fptr, (fptr->Fptr)->headstart[hdunum], REPORT_EOF, status) <= 0)
    {
        /* temporarily save current values, in case of error */
        xcurhdu = (fptr->Fptr)->curhdu;
        xmaxhdu = (fptr->Fptr)->maxhdu;
        xheadend = (fptr->Fptr)->headend;

        /* set new parameter values */
        (fptr->Fptr)->curhdu = hdunum;
        fptr->HDUposition    = hdunum;
        (fptr->Fptr)->maxhdu = maxvalue((fptr->Fptr)->maxhdu, hdunum);
        (fptr->Fptr)->headend = (fptr->Fptr)->logfilesize; /* set max size */

        if (ffrhdu(fptr, exttype, status) > 0)
        {   /* failed to get the new HDU, so restore previous values */
            (fptr->Fptr)->curhdu = xcurhdu;
            fptr->HDUposition    = xcurhdu;
            (fptr->Fptr)->maxhdu = xmaxhdu;
            (fptr->Fptr)->headend = xheadend;
        }
    }
    return(*status);
}